

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  long lVar1;
  _Alloc_hider _Var2;
  int iVar3;
  pointer pbVar4;
  vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *this_00;
  size_t i;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  string filter;
  string groupName;
  TestCaseFilters filters;
  string local_158;
  ConfigData *local_138;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *local_130;
  TestCaseFilter local_128;
  undefined1 *local_100;
  ulong local_f8;
  undefined1 local_f0 [16];
  undefined1 *local_e0;
  ulong local_d8;
  undefined1 local_d0 [16];
  ConfigData *local_c0;
  string local_b8;
  TestCaseFilters local_98;
  
  (this->super_SharedImpl<Catch::IConfig>).m_rc = 0;
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_001656a0;
  ConfigData::ConfigData(&this->m_data,data);
  (this->m_stream).streamBuf = (streambuf *)0x0;
  (this->m_stream).isOwned = false;
  std::ostream::ostream(&this->m_os,*(streambuf **)(__cxa_end_catch + *(long *)(std::cout + -0x18)))
  ;
  (this->m_filterSets).
  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_filterSets).
  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_filterSets).
  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar4 = (data->testsOrTags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (data->testsOrTags).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_130 = &this->m_filterSets;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    lVar6 = 0;
    uVar5 = 0;
    local_138 = &this->m_data;
    do {
      if (uVar5 != 0) {
        std::__cxx11::string::append((char *)&local_b8);
        pbVar4 = (pointer)((long)&(((data->testsOrTags).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar6);
      }
      std::__cxx11::string::_M_append((char *)&local_b8,(ulong)(pbVar4->_M_dataplus)._M_p);
      uVar5 = uVar5 + 1;
      pbVar4 = (data->testsOrTags).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (ulong)((long)(data->testsOrTags).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5));
    TestCaseFilters::TestCaseFilters(&local_98,&local_b8);
    pbVar4 = (data->testsOrTags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c0 = data;
    if ((data->testsOrTags).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
      lVar6 = 8;
      uVar5 = 0;
      do {
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        lVar1 = *(long *)((long)pbVar4 + lVar6 + -8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,lVar1,
                   *(long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar6) + lVar1);
        local_100 = local_f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"[","");
        if (local_158._M_string_length < local_f8) {
LAB_00140273:
          local_e0 = local_d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"~[","");
          if (local_158._M_string_length < local_d8) {
            bVar8 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_128,(ulong)&local_158);
            _Var2._M_p = local_128.m_stringToMatch._M_dataplus._M_p;
            if (local_128.m_stringToMatch._M_string_length == local_d8) {
              if (local_128.m_stringToMatch._M_string_length == 0) {
                bVar8 = true;
              }
              else {
                iVar3 = bcmp(local_128.m_stringToMatch._M_dataplus._M_p,local_e0,
                             local_128.m_stringToMatch._M_string_length);
                bVar8 = iVar3 == 0;
              }
            }
            else {
              bVar8 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var2._M_p != &local_128.m_stringToMatch.field_2) {
              operator_delete(_Var2._M_p);
            }
          }
          if (local_e0 != local_d0) {
            operator_delete(local_e0);
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_128,(ulong)&local_158);
          _Var2._M_p = local_128.m_stringToMatch._M_dataplus._M_p;
          if (local_128.m_stringToMatch._M_string_length == local_f8) {
            if (local_128.m_stringToMatch._M_string_length == 0) {
              bVar7 = true;
            }
            else {
              iVar3 = bcmp(local_128.m_stringToMatch._M_dataplus._M_p,local_100,
                           local_128.m_stringToMatch._M_string_length);
              bVar7 = iVar3 == 0;
            }
          }
          else {
            bVar7 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var2._M_p != &local_128.m_stringToMatch.field_2) {
            operator_delete(_Var2._M_p);
          }
          bVar8 = true;
          if (!bVar7) goto LAB_00140273;
        }
        if (local_100 != local_f0) {
          operator_delete(local_100);
        }
        if (bVar8) {
          TestCaseFilters::addTags(&local_98,&local_158);
        }
        else {
          TestCaseFilter::TestCaseFilter(&local_128,&local_158,AutoDetectBehaviour);
          this_00 = &local_98.m_inclusionFilters;
          if (local_128.m_filterType == ExcludeTests) {
            this_00 = &local_98.m_exclusionFilters;
          }
          std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::push_back
                    (this_00,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128.m_stringToMatch._M_dataplus._M_p != &local_128.m_stringToMatch.field_2) {
            operator_delete(local_128.m_stringToMatch._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        uVar5 = uVar5 + 1;
        pbVar4 = (local_c0->testsOrTags).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x20;
      } while (uVar5 < (ulong)((long)(local_c0->testsOrTags).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5)
              );
    }
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              (local_130,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_name._M_dataplus._M_p != &local_98.m_name.field_2) {
      operator_delete(local_98.m_name._M_dataplus._M_p);
    }
    std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
              (&local_98.m_exclusionFilters);
    std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
              (&local_98.m_inclusionFilters);
    std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::~vector
              (&local_98.m_tagExpressions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

Config( ConfigData const& data )
        :   m_data( data ),
            m_os( std::cout.rdbuf() )
        {
            if( !data.testsOrTags.empty() ) {
                std::string groupName;
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    if( i != 0 )
                        groupName += " ";
                    groupName += data.testsOrTags[i];
                }
                TestCaseFilters filters( groupName );
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    std::string filter = data.testsOrTags[i];
                    if( startsWith( filter, "[" ) || startsWith( filter, "~[" ) )
                        filters.addTags( filter );
                    else
                        filters.addFilter( TestCaseFilter( filter ) );
                }
                m_filterSets.push_back( filters );
            }
        }